

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float __thiscall pbrt::SummedAreaTable::Sum(SummedAreaTable *this,Bounds2f *extent)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double s;
  undefined8 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  
  dVar2 = lookup((SummedAreaTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (Float)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(Float)in_stack_ffffffffffffffd8)
  ;
  dVar3 = lookup((SummedAreaTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (Float)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(Float)in_stack_ffffffffffffffd8)
  ;
  dVar2 = dVar2 - dVar3;
  lookup((SummedAreaTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         (Float)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  lookup((SummedAreaTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         (Float)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  pfVar1 = std::max<float>((float *)&stack0xffffffffffffffe4,(float *)&stack0xffffffffffffffe0);
  return *pfVar1;
}

Assistant:

PBRT_CPU_GPU
    Float Sum(const Bounds2f &extent) const {
        double s = ((lookup(extent.pMax.x, extent.pMax.y) -
                     lookup(extent.pMin.x, extent.pMax.y)) +
                    (lookup(extent.pMin.x, extent.pMin.y) -
                     lookup(extent.pMax.x, extent.pMin.y)));
        return std::max<Float>(s, 0);
    }